

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load>::tryToOptimizePropagatedAdd
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this,Expression *oneSide
          ,Expression *otherSide,LocalGet *ptr,LocalSet *set)

{
  bool bVar1;
  Index IVar2;
  ulong uVar3;
  Expression *pEVar4;
  Literal local_48;
  
  if ((oneSide->_id == ConstId) && (otherSide->_id != ConstId)) {
    Literal::Literal(&local_48,(Literal *)(oneSide + 1));
    uVar3 = Literal::getInteger(&local_48);
    if ((uVar3 < 0x400) && (uVar3 = uVar3 + (this->curr->offset).addr, uVar3 < 0x400)) {
      Literal::~Literal(&local_48);
      if (((otherSide->_id == LocalGetId) &&
          (bVar1 = LazyLocalGraph::isSSA(this->localGraph,*(Index *)(otherSide + 1)), bVar1)) &&
         (bVar1 = LazyLocalGraph::isSSA(this->localGraph,ptr->index), bVar1)) {
        IVar2 = *(Index *)(otherSide + 1);
      }
      else {
        IVar2 = OptimizeAddedConstants::getHelperIndex(this->parent,set);
      }
      (this->curr->offset).addr = uVar3;
      pEVar4 = (Expression *)MixedArena::allocSpace(&this->module->allocator,0x18,8);
      pEVar4->_id = LocalGetId;
      *(Index *)(pEVar4 + 1) = IVar2;
      (pEVar4->type).id = 2;
      this->curr->ptr = pEVar4;
      return true;
    }
    Literal::~Literal(&local_48);
  }
  return false;
}

Assistant:

bool tryToOptimizePropagatedAdd(Expression* oneSide,
                                  Expression* otherSide,
                                  LocalGet* ptr,
                                  LocalSet* set) {
    if (auto* c = oneSide->dynCast<Const>()) {
      if (otherSide->is<Const>()) {
        // Both sides are constant - this is not optimized code, ignore.
        return false;
      }
      auto result = canOptimizeConstant(c->value);
      if (result.succeeded) {
        // Looks good, but we need to make sure the other side cannot change:
        //
        //  x = y + 10
        //  y = y + 1
        //  load(x)
        //
        // This example should *not* be optimized into
        //
        //  load(y, offset=10)
        //
        // If the other side is a get, we may be able to prove that we can just
        // use that same local, if both it and the pointer are in SSA form. In
        // that case,
        //
        //  y = .. // single assignment that dominates all uses
        //  x = y + 10 // single assignment that dominates all uses
        //  [..]
        //  load(x) => load(y, offset=10)
        //
        // This is valid since dominance is transitive, so y's definition
        // dominates the load, and it is ok to replace x with y + 10 there.
        Index index = -1;
        bool canReuseIndex = false;
        if (auto* get = otherSide->dynCast<LocalGet>()) {
          if (localGraph->isSSA(get->index) && localGraph->isSSA(ptr->index)) {
            index = get->index;
            canReuseIndex = true;
          }
        }
        // If we can't reuse the index, then create a new one,
        //
        //  x = y + 10
        //  y = y + 1
        //  load(x)
        // =>
        //  y' = y
        //  x = y' + 10
        //  y = y + 1
        //  load(y', offset=10)
        //
        // Often x has no other uses and later passes can remove it.
        if (!canReuseIndex) {
          index = parent->getHelperIndex(set);
        }
        curr->offset = result.total;
        curr->ptr = Builder(*module).makeLocalGet(index, Type::i32);
        return true;
      }
    }
    return false;
  }